

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

Promise<kj::Rc<kj::Refcounted>_> __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::completeThirdParty
          (ConnectionImpl *this,Reader completion)

{
  long in_RSI;
  uint64_t token;
  
  if (completion._reader.dataSize < 0x40) {
    token = 0;
  }
  else {
    token = *completion._reader.data;
  }
  getTphExchange(*(TestVat **)(in_RSI + 0x20),token);
  kj::ForkedPromise<kj::Rc<kj::Refcounted>_>::addBranch
            ((ForkedPromise<kj::Rc<kj::Refcounted>_> *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Rc<kj::Refcounted>> completeThirdParty(
        test::TestThirdPartyCompletion::Reader completion) override {
      auto& xchg = vat.getTphExchange(completion.getToken());
      return xchg.promise.addBranch();
    }